

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *param_data,int *_woffset,int *_hoffset,int *_doffset,
          int *_coffset,int *_outw,int *_outh,int *_outd,int *_outc)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar5 = 0x10;
  lVar6 = 4;
  lVar4 = 0xc;
  switch(bottom_blob->dims) {
  case 1:
    piVar1 = param_data;
    goto LAB_001aabdf;
  case 2:
    _outd = _outw;
    piVar3 = param_data;
    _outw = _outh;
    lVar2 = lVar4;
    lVar7 = lVar5;
    goto LAB_001aabc3;
  case 3:
    lVar7 = 0x14;
    lVar2 = 8;
    piVar1 = _outw;
    _doffset = _woffset;
    _outd = _outh;
    _woffset = _coffset;
    piVar3 = param_data;
    break;
  case 4:
    *_woffset = *param_data;
    *_hoffset = param_data[1];
    lVar7 = 0x1c;
    lVar5 = 0x18;
    lVar4 = 0x14;
    lVar2 = 0x10;
    lVar6 = 0xc;
    piVar1 = _outh;
    _hoffset = _coffset;
    _woffset = _outw;
    piVar3 = param_data + 2;
    break;
  default:
    goto switchD_001aab22_default;
  }
  *_doffset = *piVar3;
  *_hoffset = *(int *)((long)param_data + lVar6);
  piVar3 = (int *)(lVar2 + (long)param_data);
  _outw = _outc;
  lVar2 = lVar5;
  _hoffset = piVar1;
  lVar6 = lVar4;
LAB_001aabc3:
  lVar4 = lVar7;
  *_woffset = *piVar3;
  *_hoffset = *(int *)((long)param_data + lVar6);
  _woffset = _outd;
  piVar1 = (int *)(lVar2 + (long)param_data);
LAB_001aabdf:
  *_woffset = *piVar1;
  *_outw = *(int *)((long)param_data + lVar4);
switchD_001aab22_default:
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, const int* param_data, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        _woffset = param_data[0];
        _outw = param_data[3];
    }
    if (dims == 2)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _outw = param_data[3];
        _outh = param_data[4];
    }
    if (dims == 3)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _coffset = param_data[2];
        _outw = param_data[3];
        _outh = param_data[4];
        _outc = param_data[5];
    }
    if (dims == 4)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _doffset = param_data[2];
        _coffset = param_data[3];
        _outw = param_data[4];
        _outh = param_data[5];
        _outd = param_data[6];
        _outc = param_data[7];
    }
}